

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_4.cpp
# Opt level: O3

char * strdup(char *__s)

{
  ulong uVar1;
  char *__dest;
  size_t __n;
  
  uVar1 = 0;
  do {
    __n = uVar1;
    uVar1 = __n + 1;
  } while (__s[__n] != '\0');
  __dest = (char *)operator_new__(uVar1);
  if (uVar1 != 1) {
    memcpy(__dest,__s,__n);
  }
  __dest[__n] = '\0';
  return __dest;
}

Assistant:

char* strdup(const char* s)
{
	size_t length = strlen(s);
	char* ss = new char[length + 1];
	for (size_t i = 0; i < length; ++i)
		ss[i] = s[i];
	ss[length] = '\0';
	return ss;
}